

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StrongWeakAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
          (BumpAllocator *this,AssertionExpr *args,Strength *args_1)

{
  StrongWeakAssertionExpr *pSVar1;
  AssertionExpr *in_RDX;
  StrongWeakAssertionExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  pSVar1 = (StrongWeakAssertionExpr *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::StrongWeakAssertionExpr::StrongWeakAssertionExpr
            (in_RSI,in_RDX,(Strength)((ulong)pSVar1 >> 0x20));
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }